

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O3

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,InterfacePortHeaderSyntax *syntax)

{
  InterfacePortHeaderSyntax *in_RAX;
  size_t sVar1;
  SyntaxNode *node;
  size_t sVar2;
  uint uVar3;
  string_view sVar4;
  Token token;
  InterfacePortHeaderSyntax *local_28;
  
  local_28 = in_RAX;
  sVar4 = Token::valueText(&syntax->nameOrKeyword);
  if ((sVar4._M_len != 0) &&
     ((sVar4._M_len != 9 ||
      ((char)*(long *)((long)sVar4._M_str + 8) != 'e' || *(long *)sVar4._M_str != 0x6361667265746e69
      )))) {
    local_28 = syntax;
    std::
    vector<slang::syntax::InterfacePortHeaderSyntax_const*,std::allocator<slang::syntax::InterfacePortHeaderSyntax_const*>>
    ::emplace_back<slang::syntax::InterfacePortHeaderSyntax_const*>
              ((vector<slang::syntax::InterfacePortHeaderSyntax_const*,std::allocator<slang::syntax::InterfacePortHeaderSyntax_const*>>
                *)&(this->meta).interfacePorts,&local_28);
  }
  sVar1 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
  if (sVar1 != 0) {
    uVar3 = 1;
    sVar1 = 0;
    do {
      node = slang::syntax::SyntaxNode::childNode((SyntaxNode *)syntax,sVar1);
      if (node == (SyntaxNode *)0x0) {
        token = slang::syntax::SyntaxNode::childToken((SyntaxNode *)syntax,sVar1);
        if (token.info != (Info *)0x0) {
          visitToken(this,token);
        }
      }
      else {
        slang::syntax::detail::
        visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                  (node,this);
      }
      sVar1 = (size_t)uVar3;
      sVar2 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
      uVar3 = uVar3 + 1;
    } while (sVar1 < sVar2);
  }
  return;
}

Assistant:

void handle(const InterfacePortHeaderSyntax& syntax) {
        std::string_view name = syntax.nameOrKeyword.valueText();
        if (name != "" && name != "interface")
            meta.interfacePorts.push_back(&syntax);
        visitDefault(syntax);
    }